

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

string * __thiscall
QPDFObjectHandle::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  QPDFObjGen local_40;
  string local_38;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *this_local;
  
  local_18 = this;
  this_local = (QPDFObjectHandle *)__return_storage_ptr__;
  bVar1 = isIndirect(this);
  if (bVar1) {
    local_40 = getObjGen(this);
    QPDFObjGen::unparse_abi_cxx11_(&local_38,&local_40,' ');
    std::operator+(__return_storage_ptr__,&local_38," R");
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    unparseResolved_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::unparse() const
{
    if (this->isIndirect()) {
        return getObjGen().unparse(' ') + " R";
    } else {
        return unparseResolved();
    }
}